

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void m68k_tr_translate_insn(DisasContextBase_conflict1 *dcbase,CPUState *cpu)

{
  target_ulong_conflict tVar1;
  TCGContext_conflict2 *pTVar2;
  CPUArchState_conflict3 *env;
  long lVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  uintptr_t o_3;
  undefined1 *puVar7;
  TCGv_i32 pTVar8;
  TCGv_i64 pTVar9;
  TCGv_i64 pTVar10;
  uintptr_t o_6;
  undefined8 *puVar11;
  uintptr_t o_5;
  uintptr_t o_1;
  TCGTemp *ts;
  uintptr_t o_2;
  TCGTemp *ts_00;
  uintptr_t o;
  TCGTemp *ts_01;
  long lVar12;
  bool bVar13;
  TCGTemp *local_78;
  TCGTemp *local_70;
  TCGTemp *local_68;
  TCGTemp *local_60;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  lVar12 = *(long *)&dcbase[6].is_jmp;
  pTVar2 = *(TCGContext_conflict2 **)(lVar12 + 0x2e8);
  env = (CPUArchState_conflict3 *)cpu->env_ptr;
  local_58 = (TCGTemp *)(ulong)dcbase[1].pc_first;
  if (*(int *)(lVar12 + 0x57c) == 0) {
    bVar13 = *(TCGTemp **)(lVar12 + 0x578 + (long)*(int *)(lVar12 + 0x39e0) * 8) == local_58;
  }
  else {
    puVar7 = (undefined1 *)g_tree_lookup(*(GTree **)(lVar12 + 0x780),&local_58);
    bVar13 = puVar7 == &DAT_00000001;
  }
  if (bVar13) {
    gen_exception((DisasContext_conflict2 *)dcbase,dcbase[1].pc_first,0x10001);
  }
  else {
    uVar6 = dcbase[1].pc_first;
    for (puVar11 = *(undefined8 **)(lVar12 + 0x358); puVar11 != (undefined8 *)0x0;
        puVar11 = (undefined8 *)*puVar11) {
      lVar3 = puVar11[1];
      if ((((*(ulong *)(lVar3 + 0x18) <= (ulong)uVar6) && ((ulong)uVar6 <= *(ulong *)(lVar3 + 0x20))
           ) || (*(ulong *)(lVar3 + 0x20) < *(ulong *)(lVar3 + 0x18))) &&
         (*(char *)(lVar3 + 0x14) != '\x01')) break;
    }
    if (puVar11 != (undefined8 *)0x0) {
      tcg_gen_op2_m68k(pTVar2,INDEX_op_movi_i32,(TCGArg)(QREG_PC + (long)pTVar2),(long)(int)uVar6);
      uVar6 = dcbase[1].pc_first;
      pTVar8 = tcg_const_i32_m68k(pTVar2,2);
      pTVar9 = tcg_const_i64_m68k(pTVar2,lVar12);
      pTVar10 = tcg_const_i64_m68k(pTVar2,(ulong)uVar6);
      ts_01 = (TCGTemp *)(pTVar9 + (long)pTVar2);
      ts = (TCGTemp *)(pTVar10 + (long)pTVar2);
      ts_00 = (TCGTemp *)(pTVar8 + (long)pTVar2);
      local_60 = (TCGTemp *)0x0;
      local_78 = ts_01;
      local_70 = ts;
      local_68 = ts_00;
      if (*(int *)(lVar12 + 0x4f8) == 1) {
        for (puVar11 = *(undefined8 **)(lVar12 + 0x358); puVar11 != (undefined8 *)0x0;
            puVar11 = (undefined8 *)*puVar11) {
          lVar3 = puVar11[1];
          if (*(char *)(lVar3 + 0x14) == '\0') {
            pTVar9 = tcg_const_i64_m68k(pTVar2,*(int64_t *)(lVar3 + 0x30));
            local_60 = (TCGTemp *)(pTVar9 + (long)pTVar2);
            (**(code **)(lVar12 + 0x178))(lVar12,lVar3,&local_78,4);
            tcg_temp_free_internal_m68k(pTVar2,(TCGTemp *)(pTVar9 + (long)pTVar2));
          }
        }
      }
      else {
        pTVar8 = tcg_const_i32_m68k(pTVar2,2);
        local_58 = ts_00;
        local_50 = (TCGTemp *)(pTVar8 + (long)pTVar2);
        local_48 = ts_01;
        local_40 = ts;
        tcg_gen_callN_m68k(pTVar2,helper_uc_tracecode,(TCGTemp *)0x0,4,&local_58);
        tcg_temp_free_internal_m68k(pTVar2,(TCGTemp *)(pTVar8 + (long)pTVar2));
      }
      tcg_temp_free_internal_m68k(pTVar2,ts);
      tcg_temp_free_internal_m68k(pTVar2,ts_01);
      tcg_temp_free_internal_m68k(pTVar2,ts_00);
      check_exit_request_m68k(pTVar2);
    }
    uVar5 = cpu_lduw_code_m68k(env,dcbase[1].pc_first);
    dcbase[1].pc_first = dcbase[1].pc_first + 2;
    (*opcode_table[uVar5 & 0xffff])(env,(DisasContext_conflict2 *)dcbase,(uint16_t)uVar5);
    uVar6 = *(uint *)((long)&dcbase[2].tb + 4);
    if (uVar6 != 0) {
      pTVar2 = *(TCGContext_conflict2 **)(*(long *)&dcbase[6].is_jmp + 0x2e8);
      *(undefined4 *)((long)&dcbase[2].tb + 4) = 0;
      do {
        uVar4 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
          }
        }
        lVar12 = *(long *)((long)pTVar2->cpu_aregs + (ulong)(uVar4 * 8));
        lVar3 = *(long *)((long)&dcbase[2].pc_first + (ulong)(uVar4 * 8));
        if (lVar12 != lVar3) {
          tcg_gen_op2_m68k(pTVar2,INDEX_op_mov_i32,(long)&pTVar2->pool_cur + lVar12,
                           (long)&pTVar2->pool_cur + lVar3);
        }
        tcg_temp_free_internal_m68k
                  (pTVar2,(TCGTemp *)
                          ((long)&pTVar2->pool_cur +
                          *(long *)(&dcbase[2].pc_first + (ulong)uVar4 * 2)));
        uVar6 = uVar6 - 1 & uVar6;
      } while (uVar6 != 0);
    }
    if (0 < (int)dcbase[4].pc_first) {
      pTVar2 = *(TCGContext_conflict2 **)(*(long *)&dcbase[6].is_jmp + 0x2e8);
      lVar12 = 0;
      do {
        tcg_temp_free_internal_m68k
                  (pTVar2,(TCGTemp *)
                          ((long)&pTVar2->pool_cur + *(long *)(&dcbase[4].is_jmp + lVar12 * 2)));
        lVar12 = lVar12 + 1;
      } while (lVar12 < (int)dcbase[4].pc_first);
    }
    dcbase[4].pc_first = 0;
    tVar1 = dcbase[1].pc_first;
    dcbase->pc_next = tVar1;
    if ((dcbase->is_jmp == DISAS_NEXT) && (0xfdf < tVar1 - (dcbase->pc_first & 0xfffff000))) {
      dcbase->is_jmp = DISAS_TOO_MANY;
    }
  }
  return;
}

Assistant:

static void m68k_tr_translate_insn(DisasContextBase *dcbase, CPUState *cpu)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);
    struct uc_struct *uc = dc->uc;
    TCGContext *tcg_ctx = uc->tcg_ctx;
    CPUM68KState *env = cpu->env_ptr;
    uint16_t insn;

    // Unicorn: end address tells us to stop emulation
    if (uc_addr_is_exit(uc, dc->pc)) {
        gen_exception(dc, dc->pc, EXCP_HLT);
        return;
    }

    // Unicorn: trace this instruction on request
    if (HOOK_EXISTS_BOUNDED(uc, UC_HOOK_CODE, dc->pc)) {

        // Sync PC in advance
        tcg_gen_movi_i32(tcg_ctx, QREG_PC, dc->pc);

        gen_uc_tracecode(tcg_ctx, 2, UC_HOOK_CODE_IDX, uc, dc->pc);
        // the callback might want to stop emulation immediately
        check_exit_request(tcg_ctx);
    }

    insn = read_im16(env, dc);

    opcode_table[insn](env, dc, insn);
    do_writebacks(dc);
    do_release(dc);

    dc->base.pc_next = dc->pc;

    if (dc->base.is_jmp == DISAS_NEXT) {
        /*
         * Stop translation when the next insn might touch a new page.
         * This ensures that prefetch aborts at the right place.
         *
         * We cannot determine the size of the next insn without
         * completely decoding it.  However, the maximum insn size
         * is 32 bytes, so end if we do not have that much remaining.
         * This may produce several small TBs at the end of each page,
         * but they will all be linked with goto_tb.
         *
         * ??? ColdFire maximum is 4 bytes; MC68000's maximum is also
         * smaller than MC68020's.
         */
        target_ulong start_page_offset
            = dc->pc - (dc->base.pc_first & TARGET_PAGE_MASK);

        if (start_page_offset >= TARGET_PAGE_SIZE - 32) {
            dc->base.is_jmp = DISAS_TOO_MANY;
        }
    }
}